

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD5.cc
# Opt level: O1

void __thiscall MD5::encodeFile(MD5 *this,char *filename,qpdf_offset_t up_to_offset)

{
  element_type *peVar1;
  int iVar2;
  FILE *__stream;
  size_t sVar3;
  uchar *puVar4;
  long *plVar5;
  size_type *psVar6;
  size_t sVar7;
  size_t __n;
  ulong uVar8;
  ulong uVar9;
  char buffer [1024];
  string local_478;
  long *local_458 [2];
  long local_448 [2];
  char local_438 [1032];
  
  __stream = (FILE *)QUtil::safe_fopen(filename,"rb");
  uVar9 = 0;
  uVar8 = 0;
  if (-1 < up_to_offset) {
    uVar8 = up_to_offset;
  }
  sVar7 = 0x400;
  do {
    while( true ) {
      __n = uVar8 - uVar9;
      if (uVar9 + sVar7 <= uVar8) {
        __n = sVar7;
      }
      if (up_to_offset < 0) {
        __n = sVar7;
      }
      sVar3 = fread(local_438,1,__n,__stream);
      sVar7 = __n;
      if (sVar3 != 0) break;
LAB_0012c7fc:
      if (sVar3 == 0) goto LAB_0012c80a;
    }
    peVar1 = (this->crypto).super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    puVar4 = QUtil::unsigned_char_pointer(local_438);
    (*peVar1->_vptr_QPDFCryptoImpl[4])(peVar1,puVar4,sVar3);
    uVar9 = uVar9 + sVar3;
    if (up_to_offset < 0) goto LAB_0012c7fc;
  } while (uVar9 < uVar8);
LAB_0012c80a:
  iVar2 = ferror(__stream);
  if (iVar2 != 0) {
    fclose(__stream);
    local_458[0] = local_448;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"MD5: read error on ","");
    plVar5 = (long *)std::__cxx11::string::append((char *)local_458);
    psVar6 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_478.field_2._M_allocated_capacity = *psVar6;
      local_478.field_2._8_8_ = plVar5[3];
      local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
    }
    else {
      local_478.field_2._M_allocated_capacity = *psVar6;
      local_478._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_478._M_string_length = plVar5[1];
    *plVar5 = (long)psVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    QUtil::throw_system_error(&local_478);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_478._M_dataplus._M_p != &local_478.field_2) {
      operator_delete(local_478._M_dataplus._M_p,local_478.field_2._M_allocated_capacity + 1);
    }
    if (local_458[0] != local_448) {
      operator_delete(local_458[0],local_448[0] + 1);
    }
  }
  fclose(__stream);
  (*((this->crypto).super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_QPDFCryptoImpl[5])();
  return;
}

Assistant:

void
MD5::encodeFile(char const* filename, qpdf_offset_t up_to_offset)
{
    char buffer[1024];

    FILE* file = QUtil::safe_fopen(filename, "rb");
    size_t len;
    size_t so_far = 0;
    size_t to_try = 1024;
    size_t up_to_size = 0;
    if (up_to_offset >= 0) {
        up_to_size = QIntC::to_size(up_to_offset);
    }
    do {
        if ((up_to_offset >= 0) && ((so_far + to_try) > up_to_size)) {
            to_try = up_to_size - so_far;
        }
        len = fread(buffer, 1, to_try, file);
        if (len > 0) {
            encodeDataIncrementally(buffer, len);
            so_far += len;
            if ((up_to_offset >= 0) && (so_far >= up_to_size)) {
                break;
            }
        }
    } while (len > 0);
    if (ferror(file)) {
        // Assume, perhaps incorrectly, that errno was set by the underlying call to read....
        (void)fclose(file);
        QUtil::throw_system_error(std::string("MD5: read error on ") + filename);
    }
    (void)fclose(file);

    this->crypto->MD5_finalize();
}